

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chizu.c
# Opt level: O3

chizu * chizu_create(void)

{
  chizu *__ptr;
  czmap *pcVar1;
  
  __ptr = (chizu *)calloc(0x20,1);
  (__ptr->size).w = 2;
  (__ptr->size).h = 2;
  pcVar1 = czmap_create(2,2);
  __ptr->map = pcVar1;
  if (pcVar1 == (czmap *)0x0) {
    free(__ptr);
    __ptr = (chizu *)0x0;
  }
  return __ptr;
}

Assistant:

chizu * chizu_create() {
    chizu * cz = chizu_internal_alloc();
    cz->size.w = 2;
    cz->size.h = 2;

    cz->map = czmap_create(cz->size.w, cz->size.h);
    if (cz->map == NULL) {
        chizu_internal_free(cz);
        return NULL;
    }
    return cz;
}